

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.cpp
# Opt level: O1

size_t BuildAndStoreLiteralPrefixCode
                 (BrotliOnePassArena *s,uint8_t *input,size_t input_size,uint8_t *depths,
                 uint16_t *bits,size_t *storage_ix,uint8_t *storage)

{
  uint32_t *histogram;
  undefined1 auVar1 [16];
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar11;
  undefined1 auVar10 [16];
  
  histogram = s->histogram;
  switchD_00570541::default(histogram,0,0x400);
  if (input_size < 0x8000) {
    if (input_size != 0) {
      sVar2 = 0;
      do {
        histogram[input[sVar2]] = histogram[input[sVar2]] + 1;
        sVar2 = sVar2 + 1;
      } while (input_size != sVar2);
    }
    lVar6 = 0;
    lVar3 = 0;
    do {
      uVar9 = histogram[lVar3];
      uVar11 = (histogram + lVar3)[1];
      uVar7 = -(uint)(-0x7ffffff6 < (int)(uVar9 ^ 0x80000000));
      uVar8 = -(uint)(-0x7ffffff6 < (int)(uVar11 ^ 0x80000000));
      uVar7 = (uVar7 & 0xb | ~uVar7 & uVar9) * 2;
      uVar8 = (uVar8 & 0xb | ~uVar8 & uVar11) * 2;
      *(ulong *)(histogram + lVar3) = CONCAT44(uVar11 + uVar8,uVar9 + uVar7);
      input_size = input_size + uVar7;
      lVar6 = lVar6 + (ulong)uVar8;
      lVar3 = lVar3 + 2;
    } while (lVar3 != 0x100);
  }
  else {
    uVar4 = 0;
    do {
      histogram[input[uVar4]] = histogram[input[uVar4]] + 1;
      auVar1 = _DAT_01406e90;
      uVar4 = uVar4 + 0x1d;
    } while (uVar4 < input_size);
    input_size = (input_size + 0x1c) / 0x1d;
    lVar6 = 0;
    lVar3 = 0;
    do {
      uVar7 = histogram[lVar3];
      uVar8 = (histogram + lVar3)[1];
      uVar9 = -(uint)(-0x7ffffff6 < (int)(uVar7 ^ 0x80000000));
      uVar11 = -(uint)(-0x7ffffff6 < (int)(uVar8 ^ 0x80000000));
      auVar10._4_4_ = (uVar11 & 0xb | ~uVar11 & uVar8) * 2;
      auVar10._0_4_ = (uVar9 & 0xb | ~uVar9 & uVar7) * 2;
      auVar10._8_8_ = 0;
      auVar10 = auVar10 | auVar1;
      *(ulong *)(histogram + lVar3) = CONCAT44(uVar8 + auVar10._4_4_,uVar7 + auVar10._0_4_);
      input_size = input_size + (auVar10._0_8_ & 0xffffffff);
      lVar6 = lVar6 + (ulong)auVar10._4_4_;
      lVar3 = lVar3 + 2;
    } while (lVar3 != 0x100);
  }
  duckdb_brotli::BrotliBuildAndStoreHuffmanTreeFast
            (s->tree,histogram,lVar6 + input_size,8,depths,bits,storage_ix,storage);
  lVar3 = 0;
  lVar5 = 0;
  do {
    if (histogram[lVar5] != 0) {
      lVar3 = lVar3 + (ulong)(histogram[lVar5] * (uint)depths[lVar5]);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  return (ulong)(lVar3 * 0x7d) / (lVar6 + input_size);
}

Assistant:

static size_t BuildAndStoreLiteralPrefixCode(BrotliOnePassArena* s,
                                             const uint8_t* input,
                                             const size_t input_size,
                                             uint8_t depths[256],
                                             uint16_t bits[256],
                                             size_t* storage_ix,
                                             uint8_t* storage) {
  uint32_t* BROTLI_RESTRICT const histogram = s->histogram;
  size_t histogram_total;
  size_t i;
  memset(histogram, 0, sizeof(s->histogram));

  if (input_size < (1 << 15)) {
    for (i = 0; i < input_size; ++i) {
      ++histogram[input[i]];
    }
    histogram_total = input_size;
    for (i = 0; i < 256; ++i) {
      /* We weigh the first 11 samples with weight 3 to account for the
         balancing effect of the LZ77 phase on the histogram. */
      const uint32_t adjust = 2 * BROTLI_MIN(uint32_t, histogram[i], 11u);
      histogram[i] += adjust;
      histogram_total += adjust;
    }
  } else {
    static const size_t kSampleRate = 29;
    for (i = 0; i < input_size; i += kSampleRate) {
      ++histogram[input[i]];
    }
    histogram_total = (input_size + kSampleRate - 1) / kSampleRate;
    for (i = 0; i < 256; ++i) {
      /* We add 1 to each population count to avoid 0 bit depths (since this is
         only a sample and we don't know if the symbol appears or not), and we
         weigh the first 11 samples with weight 3 to account for the balancing
         effect of the LZ77 phase on the histogram (more frequent symbols are
         more likely to be in backward references instead as literals). */
      const uint32_t adjust = 1 + 2 * BROTLI_MIN(uint32_t, histogram[i], 11u);
      histogram[i] += adjust;
      histogram_total += adjust;
    }
  }
  BrotliBuildAndStoreHuffmanTreeFast(s->tree, histogram, histogram_total,
                                     /* max_bits = */ 8,
                                     depths, bits, storage_ix, storage);
  {
    size_t literal_ratio = 0;
    for (i = 0; i < 256; ++i) {
      if (histogram[i]) literal_ratio += histogram[i] * depths[i];
    }
    /* Estimated encoding ratio, millibytes per symbol. */
    return (literal_ratio * 125) / histogram_total;
  }
}